

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O3

void __thiscall
wasm::SuffixTreeTest_TestSingleRepetition_Test::TestBody
          (SuffixTreeTest_TestSingleRepetition_Test *this)

{
  uint *this_00;
  uint uVar1;
  uint *puVar2;
  char *pcVar3;
  uint *puVar4;
  initializer_list<unsigned_int> __l;
  undefined1 *puStack_218;
  SuffixTree ST;
  undefined4 uStack_204;
  SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode> local_200 [104];
  SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> local_198 [104];
  SuffixTreeInternalNode *local_130;
  RepeatedSubstringIterator local_108;
  void *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> SimpleRepetitionData;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  SubStrings;
  undefined1 local_88 [8];
  iterator It;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  puStack_218 = &DAT_200000001;
  _ST = &DAT_200000001;
  __l._M_len = 5;
  __l._M_array = (iterator)&puStack_218;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,__l,
             (allocator_type *)local_88);
  ::wasm::SuffixTree::SuffixTree((SuffixTree *)&puStack_218,(vector *)&local_c0);
  SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)local_88,local_130);
  if (CONCAT71(local_88._1_7_,local_88[0]) != 0) {
    do {
      std::
      vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ::push_back((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                   *)&SimpleRepetitionData.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)&It);
      SuffixTree::RepeatedSubstringIterator::operator++
                (&local_108,(RepeatedSubstringIterator *)local_88,0);
      if (local_108.InternalNodesToVisit.
          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.InternalNodesToVisit.
                        super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.InternalNodesToVisit.
                              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.InternalNodesToVisit.
                              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.RS.StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.RS.StartIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.RS.StartIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.RS.StartIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (CONCAT71(local_88._1_7_,local_88[0]) != 0);
  }
  if (It.RS.StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(It.RS.StartIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)It.InternalNodesToVisit.
                          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)It.RS.StartIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (It.RS._0_8_ != 0) {
    operator_delete((void *)It.RS._0_8_,
                    (long)It.RS.StartIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - It.RS._0_8_);
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (-(long)SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage >> 5);
  It.MinLength = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_88,"SubStrings.size()","1u",(unsigned_long *)&local_38,&It.MinLength)
  ;
  if (local_88[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (It.N == (SuffixTreeNode *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)It.N;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&It.MinLength,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&It.MinLength,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (It.N != (SuffixTreeNode *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)It.N)
      ;
    }
  }
  else {
    if (It.N != (SuffixTreeNode *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)It.N)
      ;
    }
    local_38._M_head_impl._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)local_88,"SubStrings[0].Length","2u",
               SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,(uint *)&local_38);
    if (local_88[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (It.N == (SuffixTreeNode *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)It.N;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&It.MinLength,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                 ,0x24,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&It.MinLength,(Message *)&local_38)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (It.N != (SuffixTreeNode *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)It.N)
      ;
    }
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (*(long *)(SimpleRepetitionData.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 4) -
          *(long *)(SimpleRepetitionData.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 2) >> 2);
    It.MinLength = 2;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_88,"SubStrings[0].StartIndices.size()","2u",
               (unsigned_long *)&local_38,&It.MinLength);
    if (local_88[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (It.N == (SuffixTreeNode *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)It.N;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&It.MinLength,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                 ,0x25,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&It.MinLength,(Message *)&local_38)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (It.N != (SuffixTreeNode *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)It.N)
      ;
    }
    puVar4 = *(uint **)(SimpleRepetitionData.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 2);
    puVar2 = *(uint **)(SimpleRepetitionData.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4);
    if (puVar4 != puVar2) {
      this_00 = &It.MinLength;
      do {
        uVar1 = *puVar4;
        local_38._M_head_impl._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"SimpleRepetitionData[StartIdx]","1u",
                   (uint *)((ulong)uVar1 * 4 + (long)local_c0),(uint *)&local_38);
        if (local_88[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)&local_38);
          pcVar3 = "";
          if (It.N != (SuffixTreeNode *)0x0) {
            pcVar3 = *(char **)It.N;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                     ,0x27,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        if (It.N != (SuffixTreeNode *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              It.N);
        }
        local_38._M_head_impl._0_4_ = 2;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_88,"SimpleRepetitionData[StartIdx + 1]","2u",
                   (uint *)((ulong)(uVar1 + 1) * 4 + (long)local_c0),(uint *)&local_38);
        if (local_88[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)&local_38);
          pcVar3 = "";
          if (It.N != (SuffixTreeNode *)0x0) {
            pcVar3 = *(char **)It.N;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                     ,0x28,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        if (It.N != (SuffixTreeNode *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              It.N);
        }
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar2);
    }
  }
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&SimpleRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::~SpecificBumpPtrAllocator(local_198);
  llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode>::~SpecificBumpPtrAllocator(local_200)
  ;
  if (puStack_218 != (undefined1 *)0x0) {
    operator_delete(puStack_218,CONCAT44(uStack_204,3) - (long)puStack_218);
  }
  if (local_c0 != (void *)0x0) {
    operator_delete(local_c0,(long)SimpleRepetitionData.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)local_c0);
  }
  return;
}

Assistant:

TEST(SuffixTreeTest, TestSingleRepetition) {
  std::vector<unsigned> SimpleRepetitionData = {1, 2, 1, 2, 3};
  SuffixTree ST(SimpleRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  ASSERT_EQ(SubStrings.size(), 1u);
  EXPECT_EQ(SubStrings[0].Length, 2u);
  EXPECT_EQ(SubStrings[0].StartIndices.size(), 2u);
  for (unsigned StartIdx : SubStrings[0].StartIndices) {
    EXPECT_EQ(SimpleRepetitionData[StartIdx], 1u);
    EXPECT_EQ(SimpleRepetitionData[StartIdx + 1], 2u);
  }
}